

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O2

void __thiscall gui::TextBox::handleMousePress(TextBox *this,Button button,Vector2f *mouseParent)

{
  element_type *peVar1;
  Vector2f VVar2;
  ulong uVar3;
  size_t sVar4;
  Vector2f *pVVar5;
  size_t i;
  ulong index;
  ulong uVar6;
  float fVar7;
  Vector2f mouseLocal;
  float local_54;
  Vector2f local_50;
  undefined1 local_48 [16];
  
  Widget::handleMousePress(&this->super_Widget,button,mouseParent);
  local_50 = Widget::toLocalOriginSpace(&this->super_Widget,mouseParent);
  if ((int)button < 3) {
    Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::emit
              (&this->onClick,&this->super_Widget,&local_50);
  }
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::emit
            (&this->onMousePress,&this->super_Widget,button,&local_50);
  sf::Text::setString(&((this->style_).
                        super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       text_,&this->visibleString_);
  peVar1 = (this->style_).super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sf::Transformable::setPosition
            (&(peVar1->text_).super_Transformable,(peVar1->textPadding_).x,(peVar1->textPadding_).y)
  ;
  local_54 = 3.4028235e+38;
  uVar6 = 0;
  for (index = 0; sVar4 = sf::String::getSize(&this->visibleString_), index <= sVar4;
      index = index + 1) {
    local_48 = ZEXT416((uint)local_50.x);
    pVVar5 = Widget::getOrigin(&this->super_Widget);
    local_48._0_4_ = (float)local_48._0_4_ + pVVar5->x;
    VVar2 = sf::Text::findCharacterPos
                      (&((this->style_).
                         super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        text_,index);
    fVar7 = ABS((float)local_48._0_4_ - VVar2.x);
    uVar3 = index;
    if (local_54 <= fVar7) {
      fVar7 = local_54;
      uVar3 = uVar6;
    }
    uVar6 = uVar3;
    local_54 = fVar7;
  }
  updateCaretPosition(this,uVar6 + this->horizontalScroll_);
  return;
}

Assistant:

void TextBox::handleMousePress(sf::Mouse::Button button, const sf::Vector2f& mouseParent) {
    baseClass::handleMousePress(button, mouseParent);
    const auto mouseLocal = toLocalOriginSpace(mouseParent);
    if (button <= sf::Mouse::Middle) {
        onClick.emit(this, mouseLocal);
    }
    onMousePress.emit(this, button, mouseLocal);

    style_->text_.setString(visibleString_);
    style_->text_.setPosition(style_->textPadding_.x, style_->textPadding_.y);
    size_t closestIndex = 0;
    float closestDistance = std::numeric_limits<float>::max();
    for (size_t i = 0; i <= visibleString_.getSize(); ++i) {
        float distance = fabs(mouseLocal.x + getOrigin().x - style_->text_.findCharacterPos(i).x);
        if (distance < closestDistance) {
            closestIndex = i;
            closestDistance = distance;
        }
    }
    GUI_DEBUG << "mouseLocal.x = " << mouseLocal.x << ", closest = " << closestIndex << ", " << closestDistance << "\n";
    updateCaretPosition(closestIndex + horizontalScroll_);
}